

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O3

bool __thiscall
Diligent::ShaderVariableIndexLocator::
TryResource<Diligent::ShaderVariableManagerGL::TextureBindInfo>
          (ShaderVariableIndexLocator *this,Uint32 NextResourceTypeOffset,Uint32 VarCount)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  char (*in_R8) [2];
  string msg;
  string local_58;
  char local_38 [8];
  
  uVar1 = this->VarOffset;
  if (uVar1 < NextResourceTypeOffset) {
    uVar3 = uVar1 - this->Mgr->m_TextureOffset;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),0);
    if (0xaaaaaaaaaaaaaaa < (uVar4 >> 3 | uVar4 << 0x3d)) {
      local_38[0] = '\x18';
      local_38[1] = '\0';
      local_38[2] = '\0';
      local_38[3] = '\0';
      local_38[4] = '\0';
      local_38[5] = '\0';
      local_38[6] = '\0';
      local_38[7] = '\0';
      FormatString<char[42],unsigned_long,char[2]>
                (&local_58,(Diligent *)"Offset is not multiple of resource type (",
                 (char (*) [42])local_38,(unsigned_long *)0x343766,in_R8);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"TryResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                 ,0x225);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    uVar3 = uVar3 / 0x18;
    if (VarCount <= uVar3) {
      FormatString<char[131]>
                (&local_58,
                 (char (*) [131])
                 "Relative offset is out of bounds which either means the variable does not belong to this SRB or there is a bug in variable offsets"
                );
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"TryResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
                 ,0x229);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    VarCount = (Uint32)uVar3;
  }
  this->Index = this->Index + VarCount;
  return uVar1 < NextResourceTypeOffset;
}

Assistant:

bool TryResource(Uint32 NextResourceTypeOffset, Uint32 VarCount)
    {
        if (VarOffset < NextResourceTypeOffset)
        {
            auto RelativeOffset = VarOffset - Mgr.GetResourceOffset<ResourceType>();
            DEV_CHECK_ERR(RelativeOffset % sizeof(ResourceType) == 0, "Offset is not multiple of resource type (", sizeof(ResourceType), ")");
            RelativeOffset /= sizeof(ResourceType);
            VERIFY(RelativeOffset >= 0 && RelativeOffset < VarCount,
                   "Relative offset is out of bounds which either means the variable does not belong to this SRB or "
                   "there is a bug in variable offsets");
            Index += static_cast<Uint32>(RelativeOffset);
            return true;
        }
        else
        {
            Index += VarCount;
            return false;
        }
    }